

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

fdb_status compactor_destroy_file(char *filename,fdb_config *config)

{
  size_t sVar1;
  avl_tree *paVar2;
  fdb_config *in_RSI;
  char *in_RDI;
  compactor_config c_config;
  fdb_status status;
  size_t strcmp_len;
  openfiles_elem_conflict *elem;
  openfiles_elem_conflict query;
  avl_node *a;
  char *in_stack_000006b8;
  compactor_config *in_stack_fffffffffffffa80;
  avl_cmp_func *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  fdb_status fVar3;
  char local_558 [1344];
  avl_node *local_18;
  fdb_config *local_10;
  char *local_8;
  
  local_18 = (avl_node *)0x0;
  fVar3 = FDB_RESULT_SUCCESS;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar1 = strlen(in_RDI);
  local_8[sVar1] = '.';
  paVar2 = (avl_tree *)(sVar1 + 1);
  local_8[(long)paVar2] = '\0';
  strcpy(local_558,local_8);
  compactor_config::compactor_config((compactor_config *)&stack0xfffffffffffffa78);
  compactor_config::operator=((compactor_config *)&stack0xfffffffffffffa78,local_10);
  compactor_init(in_stack_fffffffffffffa80);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  compactor_args.strcmp_len = (size_t)paVar2;
  paVar2 = (avl_tree *)compactor_args.strcmp_len;
  local_18 = avl_search((avl_tree *)compactor_args.strcmp_len,
                        (avl_node *)CONCAT44(fVar3,in_stack_fffffffffffffa90),
                        in_stack_fffffffffffffa88);
  if (local_18 != (avl_node *)0x0) {
    if (((ulong)local_18[-1].left & 0x10000000000) == 0) {
      fVar3 = FDB_RESULT_FILE_IS_BUSY;
    }
    else {
      fVar3 = FDB_RESULT_IN_USE_BY_COMPACTOR;
    }
  }
  compactor_args.strcmp_len = 0x400;
  pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  local_8[(long)((long)&paVar2[-1].aux + 7)] = '\0';
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = _compactor_search_n_destroy(in_stack_000006b8);
  }
  return fVar3;
}

Assistant:

fdb_status compactor_destroy_file(char *filename,
                                  fdb_config *config)
{
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;
    size_t strcmp_len;
    fdb_status status = FDB_RESULT_SUCCESS;

    strcmp_len = strlen(filename);
    filename[strcmp_len] = '.'; // add a . suffix in place
    strcmp_len++;
    filename[strcmp_len] = '\0';
    strcpy(query.filename, filename);

    compactor_config c_config;
    c_config = *config;
    compactor_init(&c_config);

    mutex_lock(&cpt_lock);
    compactor_args.strcmp_len = strcmp_len; // Do prefix match for all vers
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        // if no handle refers this file
        if (elem->daemon_compact_in_progress) {
            // This file is waiting for compaction by compactor
            // Return a temporary failure, user must retry after sometime
            status = FDB_RESULT_IN_USE_BY_COMPACTOR;
        } else { // File handle not closed, fail operation
            status = FDB_RESULT_FILE_IS_BUSY;
        }
    }

    compactor_args.strcmp_len = MAX_FNAMELEN; // restore for normal compare
    mutex_unlock(&cpt_lock); // Releasing the lock here should be OK as file
                             // deletions doesn't require strict synchronization.
    filename[strcmp_len - 1] = '\0'; // restore the filename
    if (status == FDB_RESULT_SUCCESS) {
        status = _compactor_search_n_destroy(filename);
    }

    return status;
}